

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void __thiscall
dmlc::JSONObjectReadHelper::
DeclareFieldInternal<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (JSONObjectReadHelper *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *addr,bool optional)

{
  const_iterator cVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  LogCheckError _check_err;
  LogCheckError local_1c0;
  uint local_1b4;
  LogMessageFatal local_1b0;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
                  *)this,key);
  local_1b0._0_8_ =
       ZEXT18((_Rb_tree_header *)cVar1._M_node != &(this->map_)._M_t._M_impl.super__Rb_tree_header);
  local_1b4 = 0;
  LogCheck_EQ<unsigned_long,unsigned_int>((dmlc *)&local_1c0,(unsigned_long *)&local_1b0,&local_1b4)
  ;
  if (local_1c0.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x3cb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"map_.count(key) == 0U",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1b0,((local_1c0.str)->_M_dataplus)._M_p,
                        (local_1c0.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Adding duplicate field ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(key->_M_dataplus)._M_p,key->_M_string_length);
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  LogCheckError::~LogCheckError(&local_1c0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
           ::operator[](&this->map_,key);
  pmVar3->func = 
  ReaderFunction<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>;
  pmVar3->addr = addr;
  pmVar3->optional = optional;
  return;
}

Assistant:

inline void JSONObjectReadHelper::
DeclareFieldInternal(const std::string &key, T *addr, bool optional) {
  CHECK_EQ(map_.count(key), 0U)
      << "Adding duplicate field " << key;
  Entry e;
  e.func = ReaderFunction<T>;
  e.addr = static_cast<void*>(addr);
  e.optional = optional;
  map_[key] = e;
}